

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasEnumDefinitions(FileDescriptor *file)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  Descriptor *message_type;
  ulong uVar5;
  
  bVar3 = true;
  if (*(int *)(file + 0x68) < 1) {
    uVar5 = (ulong)*(int *)(file + 0x58);
    bVar3 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      message_type = *(Descriptor **)(file + 0x60);
      bVar2 = HasEnumDefinitions(message_type);
      if (!bVar2) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          message_type = message_type + 0xa8;
          if (uVar5 == uVar4) break;
          bVar3 = HasEnumDefinitions(message_type);
          uVar1 = uVar4 + 1;
        } while (!bVar3);
        bVar3 = uVar4 < uVar5;
      }
    }
  }
  return bVar3;
}

Assistant:

bool HasEnumDefinitions(const FileDescriptor* file) {
  if (file->enum_type_count() > 0) return true;
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (HasEnumDefinitions(file->message_type(i))) return true;
  }
  return false;
}